

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeotriangle.cpp
# Opt level: O2

int __thiscall pzgeom::TPZGeoTriangle::ClassId(TPZGeoTriangle *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TPZGeoTriangle",&local_39)
  ;
  uVar1 = Hash(&local_38);
  iVar2 = TPZNodeRep<3,_pztopology::TPZTriangle>::ClassId
                    (&this->super_TPZNodeRep<3,_pztopology::TPZTriangle>);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoTriangle::ClassId() const{
        return Hash("TPZGeoTriangle") ^ TPZNodeRep<3, pztopology::TPZTriangle>::ClassId() << 1;
    }